

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFieldInfo.h
# Opt level: O3

DataFieldInfo * __thiscall ser::DataFieldInfo::operator=(DataFieldInfo *this,DataFieldInfo *other)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::_M_assign((string *)&this->type_);
  iVar1 = other->rank_;
  iVar2 = other->iSize_;
  iVar3 = other->jSize_;
  this->bytesPerElement_ = other->bytesPerElement_;
  this->rank_ = iVar1;
  this->iSize_ = iVar2;
  this->jSize_ = iVar3;
  this->jPlusHalo_ = other->jPlusHalo_;
  this->kPlusHalo_ = other->kPlusHalo_;
  this->lPlusHalo_ = other->lPlusHalo_;
  iVar1 = other->lSize_;
  iVar2 = other->iPlusHalo_;
  iVar3 = other->iMinusHalo_;
  this->kSize_ = other->kSize_;
  this->lSize_ = iVar1;
  this->iPlusHalo_ = iVar2;
  this->iMinusHalo_ = iVar3;
  this->jMinusHalo_ = other->jMinusHalo_;
  this->kMinusHalo_ = other->kMinusHalo_;
  this->lMinusHalo_ = other->lMinusHalo_;
  MetainfoSet::operator=(&this->metainfo_,&other->metainfo_);
  return this;
}

Assistant:

DataFieldInfo& operator=(const DataFieldInfo& other)
        {
            name_ = other.name_;
            type_ = other.type_;
            bytesPerElement_ = other.bytesPerElement_;
            rank_ = other.rank_;
            iSize_ = other.iSize_;
            jSize_ = other.jSize_;
            kSize_ = other.kSize_;
            lSize_ = other.lSize_;
            iPlusHalo_ = other.iPlusHalo_;
            jPlusHalo_ = other.jPlusHalo_;
            kPlusHalo_ = other.kPlusHalo_;
            lPlusHalo_ = other.lPlusHalo_;
            iMinusHalo_ = other.iMinusHalo_;
            jMinusHalo_ = other.jMinusHalo_;
            kMinusHalo_ = other.kMinusHalo_;
            lMinusHalo_ = other.lMinusHalo_;
            metainfo_ = other.metainfo_;

            return *this;
        }